

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

ModelPtr setupFlattenImportedUnitsThroughComponent(string *baseModelName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ModelPtr MVar2;
  ComponentPtr ic;
  ModelPtr model;
  UnitsPtr u;
  ImportSourcePtr import;
  ImporterPtr importer;
  ModelPtr importModel;
  long *local_e8 [2];
  long local_d8 [2];
  long local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  shared_ptr *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  string *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  ModelPtr local_98;
  undefined1 local_88 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  _Alloc_hider local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  local_38._M_p = (pointer)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::Importer::create(SUB81(local_88,0));
  createBaseModelImport(&local_98,(string *)&local_38);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"main_model","");
  libcellml::Model::create((string *)&local_b8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"my_component","");
  libcellml::Component::create((string *)&local_c8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_c8 + 0x10));
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"my_component","");
  libcellml::ImportedEntity::setImportReference((string *)(local_c8 + 0x10));
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"fmol","");
  libcellml::Units::create((string *)&local_a8);
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"mole","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"femto","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
  libcellml::Units::addUnit(local_a8,(string *)local_e8,1.0,1.0,(string *)local_58);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0],local_d8[0] + 1);
  }
  libcellml::ComponentEntity::addComponent(local_b8);
  libcellml::Model::addUnits(local_b8);
  libcellml::Importer::flattenModel((shared_ptr *)baseModelName);
  _Var1._M_pi = extraout_RDX;
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    _Var1._M_pi = extraout_RDX_02;
  }
  if (local_98.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_03;
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    _Var1._M_pi = extraout_RDX_04;
  }
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    _Var1._M_pi = extraout_RDX_05;
  }
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)baseModelName;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr setupFlattenImportedUnitsThroughComponent(const std::string &baseModelName)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, baseModelName);

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::ComponentPtr ic = libcellml::Component::create("my_component");
    ic->setImportSource(import);
    ic->setImportReference("my_component");

    libcellml::UnitsPtr u = libcellml::Units::create("fmol");
    u->addUnit("mole", "femto");

    model->addComponent(ic);
    model->addUnits(u);

    return importer->flattenModel(model);
}